

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amp1394Time.cpp
# Opt level: O2

double Amp1394_GetTime(void)

{
  timeval currentTime;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  return (double)local_18.tv_usec * 1e-06 + (double)local_18.tv_sec;
}

Assistant:

double Amp1394_GetTime(void)
{
#ifdef _MSC_VER
    LARGE_INTEGER liTimerFrequency, liTimeNow;
    double timerFrequency, time;
    // According to MSDN, these functions are guaranteed to work
    // on Windows XP or later.
    if ((QueryPerformanceCounter(&liTimeNow) == 0) ||
        (QueryPerformanceFrequency(&liTimerFrequency) == 0)) {
	 // No performance counter available
	 return 0.0;
    }
    timerFrequency = (double)liTimerFrequency.QuadPart;
    // Also, the frequency is guaranteed to be non-zero on Windows XP or later.
    if (timerFrequency == 0.0) return 0.0;
    time = (double)liTimeNow.QuadPart/timerFrequency;
    return time;
#else
    struct timeval currentTime;
    gettimeofday(&currentTime, NULL);
    return ((double) currentTime.tv_sec) + ((double)currentTime.tv_usec) * 1e-6;
#endif
}